

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdHash160(void *handle,char *message,bool has_text,char **output)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 *in_RCX;
  byte in_DL;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData160 data;
  string *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe30;
  allocator *paVar3;
  string *in_stack_fffffffffffffe70;
  string local_188;
  allocator local_161;
  string local_160;
  ByteData local_140;
  ByteData160 local_128;
  allocator local_109;
  string local_108 [32];
  ByteData160 local_e8;
  ByteData160 local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  byte local_19;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 == (char *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x40f;
    local_50.funcname = "CfdHash160";
    cfd::core::logger::warn<>(&local_50,"message is null.");
    local_72 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. message is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
    local_72 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x415;
    local_90.funcname = "CfdHash160";
    cfd::core::logger::warn<>(&local_90,"output is null.");
    local_b2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. output is null.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
    local_b2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ByteData160::ByteData160(&local_d0);
  if ((local_19 & 1) == 0) {
    paVar3 = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,local_18,paVar3);
    cfd::core::ByteData::ByteData(&local_140,&local_160);
    cfd::core::HashUtil::Hash160(&local_128,&local_140);
    cfd::core::ByteData160::operator=(&local_d0,&local_128);
    cfd::core::ByteData160::~ByteData160((ByteData160 *)0x5a9ad7);
    cfd::core::ByteData::~ByteData((ByteData *)0x5a9ae4);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,local_18,&local_109);
    cfd::core::HashUtil::Hash160(&local_e8,(string *)local_108);
    cfd::core::ByteData160::operator=(&local_d0,&local_e8);
    cfd::core::ByteData160::~ByteData160((ByteData160 *)0x5a99c2);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_188,&local_d0);
  pcVar2 = cfd::capi::CreateString(in_stack_fffffffffffffe70);
  *local_28 = pcVar2;
  std::__cxx11::string::~string((string *)&local_188);
  local_4 = 0;
  cfd::core::ByteData160::~ByteData160((ByteData160 *)0x5a9be9);
  return local_4;
}

Assistant:

int CfdHash160(
    void* handle, const char* message, bool has_text, char** output) {
  try {
    cfd::Initialize();
    if (message == nullptr) {
      warn(CFD_LOG_SOURCE, "message is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. message is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }

    cfd::core::ByteData160 data;
    if (has_text) {
      data = cfd::core::HashUtil::Hash160(std::string(message));
    } else {
      data = cfd::core::HashUtil::Hash160(ByteData(message));
    }
    *output = cfd::capi::CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}